

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera2png.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  plutosvg_document_t *document_00;
  plutovg_surface_t *local_20;
  plutovg_surface_t *surface;
  plutosvg_document_t *document;
  
  local_20 = (plutovg_surface_t *)0x0;
  fprintf(_stdout,"Loading \'camera.svg\'\n");
  document_00 = plutosvg_document_load_from_file("camera.svg",-1.0,-1.0);
  if (document_00 == (plutosvg_document_t *)0x0) {
    fprintf(_stderr,"Unable to load \'camera.svg\'\n");
  }
  else {
    fprintf(_stdout,"Rendering \'camera.svg\'\n");
    local_20 = plutosvg_document_render_to_surface
                         (document_00,(char *)0x0,-1,-1,(plutovg_color_t *)0x0,
                          (plutosvg_palette_func_t)0x0,(void *)0x0);
    if (local_20 == (plutovg_surface_t *)0x0) {
      fprintf(_stderr,"Unable to render \'camera.svg\'\n");
    }
    else {
      fprintf(_stdout,"Writing \'camera.png\'\n");
      _Var1 = plutovg_surface_write_to_png(local_20,"camera.png");
      if (!_Var1) {
        fprintf(_stderr,"Unable to write \'camera.png\'\n");
      }
    }
  }
  plutovg_surface_destroy(local_20);
  plutosvg_document_destroy(document_00);
  return 0;
}

Assistant:

int main(void)
{
    plutosvg_document_t* document = NULL;
    plutovg_surface_t* surface = NULL;

    fprintf(stdout, "Loading 'camera.svg'\n");
    document = plutosvg_document_load_from_file("camera.svg", -1, -1);
    if(document == NULL) {
        fprintf(stderr, "Unable to load 'camera.svg'\n");
        goto cleanup;
    }

    fprintf(stdout, "Rendering 'camera.svg'\n");
    surface = plutosvg_document_render_to_surface(document, NULL, -1, -1, NULL, NULL, NULL);
    if(surface == NULL) {
        fprintf(stderr, "Unable to render 'camera.svg'\n");
        goto cleanup;
    }

    fprintf(stdout, "Writing 'camera.png'\n");
    if(!plutovg_surface_write_to_png(surface, "camera.png")) {
        fprintf(stderr, "Unable to write 'camera.png'\n");
        goto cleanup;
    }

cleanup:
    plutovg_surface_destroy(surface);
    plutosvg_document_destroy(document);
    return 0;
}